

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

microseconds __thiscall
RandomMixin<FastRandomContext>::rand_exp_duration
          (RandomMixin<FastRandomContext> *this,microseconds mean)

{
  long lVar1;
  uint64_t uniform;
  long in_FS_OFFSET;
  double dVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uniform = FastRandomContext::rand64((FastRandomContext *)this);
  dVar2 = MakeExponentiallyDistributed(uniform);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (microseconds)(long)ROUND((double)mean.__r * dVar2 + 0.5);
  }
  __stack_chk_fail();
}

Assistant:

std::chrono::microseconds rand_exp_duration(std::chrono::microseconds mean) noexcept
    {
        using namespace std::chrono_literals;
        auto unscaled = MakeExponentiallyDistributed(Impl().rand64());
        return std::chrono::duration_cast<std::chrono::microseconds>(unscaled * mean + 0.5us);
    }